

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

string * __thiscall
cmGeneratorTarget::GetRuntimeLinkLibrary
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *lang,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  cmTarget *this_01;
  pointer pcVar2;
  cmValue cVar3;
  cmValue cVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string local_a8;
  string *local_88;
  string local_80;
  string local_60;
  undefined8 local_40;
  char *local_38;
  
  this_00 = this->Makefile;
  local_60.field_2._8_8_ = (lang->_M_dataplus)._M_p;
  local_60.field_2._M_allocated_capacity = lang->_M_string_length;
  local_60._M_dataplus._M_p = (pointer)0x6;
  local_60._M_string_length = 0x7607e7;
  local_40 = 0x18;
  local_38 = "_RUNTIME_LIBRARY_DEFAULT";
  views._M_len = 3;
  views._M_array = (iterator)&local_60;
  local_88 = config;
  cmCatViews_abi_cxx11_(&local_a8,views);
  cVar3 = cmMakefile::GetDefinition(this_00,&local_a8);
  paVar1 = &local_a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  if ((cVar3.Value == (string *)0x0) || ((cVar3.Value)->_M_string_length == 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    this_01 = this->Target;
    local_60._M_string_length = (size_type)(lang->_M_dataplus)._M_p;
    local_60._M_dataplus._M_p = (pointer)lang->_M_string_length;
    local_60.field_2._M_allocated_capacity = 0x10;
    local_60.field_2._8_8_ = (long)"CMAKE_CUDA_RUNTIME_LIBRARY" + 10;
    views_00._M_len = 2;
    views_00._M_array = (iterator)&local_60;
    cmCatViews_abi_cxx11_(&local_a8,views_00);
    cVar4 = cmTarget::GetProperty(this_01,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,
                      CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                               local_a8.field_2._M_local_buf[0]) + 1);
    }
    if (cVar4.Value != (string *)0x0) {
      cVar3 = cVar4;
    }
    pcVar2 = ((cVar3.Value)->_M_dataplus)._M_p;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar2,pcVar2 + (cVar3.Value)->_M_string_length);
    local_a8._M_string_length = 0;
    local_a8.field_2._M_local_buf[0] = '\0';
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    cmGeneratorExpression::Evaluate
              (&local_60,&local_80,this->LocalGenerator,local_88,this,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_a8);
    cmsys::SystemTools::UpperCase(__return_storage_ptr__,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,
                      CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                               local_a8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetRuntimeLinkLibrary(
  std::string const& lang, std::string const& config) const
{
  // This is activated by the presence of a default selection whether or
  // not it is overridden by a property.
  cmValue runtimeLibraryDefault = this->Makefile->GetDefinition(
    cmStrCat("CMAKE_", lang, "_RUNTIME_LIBRARY_DEFAULT"));
  if (!cmNonempty(runtimeLibraryDefault)) {
    return std::string();
  }
  cmValue runtimeLibraryValue =
    this->Target->GetProperty(cmStrCat(lang, "_RUNTIME_LIBRARY"));
  if (!runtimeLibraryValue) {
    runtimeLibraryValue = runtimeLibraryDefault;
  }
  return cmSystemTools::UpperCase(cmGeneratorExpression::Evaluate(
    *runtimeLibraryValue, this->LocalGenerator, config, this));
}